

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

Balance * wallet::GetBalance(Balance *__return_storage_ptr__,CWallet *wallet,int min_depth,
                            bool avoid_reuse)

{
  CWalletTx *wtx;
  bool bVar1;
  int iVar2;
  CAmount CVar3;
  CAmount CVar4;
  _Hash_node_base *p_Var5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  long local_b0;
  isminefilter local_7c;
  unique_lock<std::recursive_mutex> local_78;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->m_watchonly_untrusted_pending = 0;
  __return_storage_ptr__->m_watchonly_immature = 0;
  __return_storage_ptr__->m_mine_immature = 0;
  __return_storage_ptr__->m_watchonly_trusted = 0;
  __return_storage_ptr__->m_mine_trusted = 0;
  __return_storage_ptr__->m_mine_untrusted_pending = 0;
  local_78._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = __return_storage_ptr__->m_mine_trusted;
  p_Var5 = (wallet->mapWallet)._M_h._M_before_begin._M_nxt;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      wtx = (CWalletTx *)(p_Var5 + 5);
      bVar1 = CachedTxIsTrusted(wallet,wtx,
                                (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                                &local_68);
      iVar2 = CWallet::GetTxDepthInMainChain(wallet,wtx);
      local_7c = (uint)!avoid_reuse << 2 | 2;
      CVar3 = CachedTxGetAvailableCredit(wallet,wtx,&local_7c);
      local_7c = (uint)!avoid_reuse << 2 | 1;
      CVar4 = CachedTxGetAvailableCredit(wallet,wtx,&local_7c);
      if (bVar1 && min_depth <= iVar2) {
        local_b0 = local_b0 + CVar3;
        __return_storage_ptr__->m_watchonly_trusted =
             __return_storage_ptr__->m_watchonly_trusted + CVar4;
      }
      if (!bVar1 && iVar2 == 0) {
        bVar1 = CWalletTx::InMempool(wtx);
        if (bVar1) {
          __return_storage_ptr__->m_mine_untrusted_pending =
               __return_storage_ptr__->m_mine_untrusted_pending + CVar3;
          __return_storage_ptr__->m_watchonly_untrusted_pending =
               __return_storage_ptr__->m_watchonly_untrusted_pending + CVar4;
        }
      }
      local_7c = 2;
      CVar3 = CachedTxGetImmatureCredit(wallet,wtx,&local_7c);
      __return_storage_ptr__->m_mine_immature = __return_storage_ptr__->m_mine_immature + CVar3;
      local_7c = 1;
      CVar3 = CachedTxGetImmatureCredit(wallet,wtx,&local_7c);
      __return_storage_ptr__->m_watchonly_immature =
           __return_storage_ptr__->m_watchonly_immature + CVar3;
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  __return_storage_ptr__->m_mine_trusted = local_b0;
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Balance GetBalance(const CWallet& wallet, const int min_depth, bool avoid_reuse)
{
    Balance ret;
    isminefilter reuse_filter = avoid_reuse ? ISMINE_NO : ISMINE_USED;
    {
        LOCK(wallet.cs_wallet);
        std::set<uint256> trusted_parents;
        for (const auto& entry : wallet.mapWallet)
        {
            const CWalletTx& wtx = entry.second;
            const bool is_trusted{CachedTxIsTrusted(wallet, wtx, trusted_parents)};
            const int tx_depth{wallet.GetTxDepthInMainChain(wtx)};
            const CAmount tx_credit_mine{CachedTxGetAvailableCredit(wallet, wtx, ISMINE_SPENDABLE | reuse_filter)};
            const CAmount tx_credit_watchonly{CachedTxGetAvailableCredit(wallet, wtx, ISMINE_WATCH_ONLY | reuse_filter)};
            if (is_trusted && tx_depth >= min_depth) {
                ret.m_mine_trusted += tx_credit_mine;
                ret.m_watchonly_trusted += tx_credit_watchonly;
            }
            if (!is_trusted && tx_depth == 0 && wtx.InMempool()) {
                ret.m_mine_untrusted_pending += tx_credit_mine;
                ret.m_watchonly_untrusted_pending += tx_credit_watchonly;
            }
            ret.m_mine_immature += CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE);
            ret.m_watchonly_immature += CachedTxGetImmatureCredit(wallet, wtx, ISMINE_WATCH_ONLY);
        }
    }
    return ret;
}